

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O0

void __thiscall
Assimp::STEP::InternGenericConvert<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcElement>_>::
operator()(InternGenericConvert<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcElement>_> *this,
          Lazy<Assimp::IFC::Schema_2x3::IfcElement> *out,
          shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *in_base,DB *db)

{
  element_type *peVar1;
  TypeError *this_00;
  DB *this_01;
  unsigned_long *puVar2;
  LazyObject *obj;
  PrimitiveDataType *local_80;
  Lazy<Assimp::IFC::Schema_2x3::IfcElement> local_70;
  undefined1 local_65;
  allocator<char> local_51;
  string local_50;
  PrimitiveDataType *local_30;
  ENTITY *in;
  DB *db_local;
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *in_base_local;
  Lazy<Assimp::IFC::Schema_2x3::IfcElement> *out_local;
  InternGenericConvert<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcElement>_> *this_local;
  
  in = (ENTITY *)db;
  db_local = (DB *)in_base;
  in_base_local = (shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)out;
  out_local = (Lazy<Assimp::IFC::Schema_2x3::IfcElement> *)this;
  peVar1 = std::__shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>::get
                     (&in_base->
                       super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                     );
  if (peVar1 == (element_type *)0x0) {
    local_80 = (PrimitiveDataType *)0x0;
  }
  else {
    local_80 = (PrimitiveDataType *)
               __dynamic_cast(peVar1,&EXPRESS::DataType::typeinfo,&EXPRESS::ENTITY::typeinfo,0);
  }
  local_30 = local_80;
  if (local_80 == (PrimitiveDataType *)0x0) {
    local_65 = 1;
    this_00 = (TypeError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"type error reading entity",&local_51);
    TypeError::TypeError(this_00,&local_50,0xffffffffffffffff,0xffffffffffffffff);
    local_65 = 0;
    __cxa_throw(this_00,&TypeError::typeinfo,TypeError::~TypeError);
  }
  this_01 = Couple<Assimp::IFC::Schema_2x3::IfcElement,Assimp::STEP::DB_const>((DB *)in);
  puVar2 = EXPRESS::PrimitiveDataType::operator_cast_to_unsigned_long_(local_30);
  obj = DB::GetObject(this_01,*puVar2);
  Lazy<Assimp::IFC::Schema_2x3::IfcElement>::Lazy(&local_70,obj);
  (in_base_local->
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)local_70.obj;
  return;
}

Assistant:

void operator()(Lazy<T>& out, const std::shared_ptr< const EXPRESS::DataType >& in_base, const STEP::DB& db) {
            const EXPRESS::ENTITY* in = dynamic_cast<const EXPRESS::ENTITY*>(in_base.get());
            if (!in) {
                throw TypeError("type error reading entity");
            }
            out = Couple<T>(db).GetObject(*in);
        }